

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_insertAString_success_middleIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString srcString;
  AString destString;
  
  private_ACUtilsTest_AString_constructTestString(&destString,"01567",8);
  private_ACUtilsTest_AString_constructTestString(&srcString,"234",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_insertAString(&destString,2,&srcString);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x336,
                      "Assertion \'AString_insertAString(&destString, 2, &srcString)\' failed",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x336);
  if (destString.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x337);
    if (destString.buffer == (char *)0x0) {
      srcString.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (destString).buffer != NULL";
      pcVar5 = "(void*) (destString).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x337);
      pcVar6 = destString.buffer;
      if (destString.buffer == (char *)0x0) {
        srcString.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("01234567",destString.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x337);
          if (destString.size != 8) {
            pcVar6 = "strlen(\"01234567\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(destString).size == strlen(\"01234567\")";
            pcVar5 = "(destString).size";
            srcString.size = destString.size;
            goto LAB_00128887;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x337);
          if (srcString.capacity == 8) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x338);
            if (srcString.buffer == (char *)0x0) {
              srcString.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (srcString).buffer != NULL";
              pcVar5 = "(void*) (srcString).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x338);
              pcVar6 = srcString.buffer;
              if (srcString.buffer == (char *)0x0) {
                pcVar6 = "(null)";
                srcString.size = 0x16819b;
              }
              else {
                iVar2 = strcmp("234",srcString.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x338);
                  if (srcString.size == 3) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x338);
                    if (private_ACUtilsTest_AString_reallocCount == 0) {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x339);
                      (*destString.deallocator)(destString.buffer);
                      (*srcString.deallocator)(srcString.buffer);
                      return;
                    }
                    pcVar6 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x339;
                    srcString.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_001289c0;
                  }
                  pcVar6 = "strlen(\"234\")";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "(srcString).size == strlen(\"234\")";
                  pcVar5 = "(srcString).size";
                  goto LAB_001289bb;
                }
                srcString.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(srcString).buffer == (\"234\")";
              pcVar5 = "(srcString).buffer";
            }
          }
          else {
            pcVar6 = "(8)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(srcString).capacity == (8)";
            pcVar5 = "(srcString).capacity";
            srcString.size = srcString.capacity;
          }
LAB_001289bb:
          iVar2 = 0x338;
          goto LAB_001289c0;
        }
        srcString.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(destString).buffer == (\"01234567\")";
      pcVar5 = "(destString).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(destString).capacity == (8)";
    pcVar5 = "(destString).capacity";
    srcString.size = destString.capacity;
  }
LAB_00128887:
  iVar2 = 0x337;
LAB_001289c0:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,srcString.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_insertAString_success_middleIndex)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01567", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("234", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_insertAString(&destString, 2, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "234", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}